

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O2

bool __thiscall
cmCTestHandlerCommand::InitialPass
          (cmCTestHandlerCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  _Var6;
  char *pcVar7;
  ostream *poVar8;
  cmValue cVar9;
  string *psVar10;
  undefined4 extraout_var;
  char *pcVar12;
  size_t sVar13;
  bool bVar14;
  cmWorkingDirectory *this_00;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  SaveRestoreErrorState errorState;
  string local_2b0;
  allocator<char> local_289;
  cmWorkingDirectory workdir;
  ostringstream cmCTestLog_msg;
  char *local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  ParseResult local_60;
  long *plVar11;
  
  errorState.InitialErrorState = cmSystemTools::GetErrorOccurredFlag();
  cmSystemTools::s_FatalErrorOccurred = false;
  cmSystemTools::s_ErrorOccurred = false;
  errorState.CaptureCMakeErrorValue = false;
  (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[7])(this);
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_60,&this->super_cmArgumentParser<void>,args,&unparsedArguments,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_60);
  (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[8])(this);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->ParsedKeywords).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->ParsedKeywords).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  _Var6 = std::
          __adjacent_find<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((this->ParsedKeywords).
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->ParsedKeywords).
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var6._M_current !=
      (this->ParsedKeywords).
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    _cmCTestLog_msg = (char *)0x24;
    local_248 = "Called with more than one value for ";
    workdir.OldDir._M_dataplus._M_p = (pointer)(_Var6._M_current)->_M_len;
    workdir.OldDir._M_string_length = (size_type)(_Var6._M_current)->_M_str;
    cmStrCat<>(&local_2b0,(cmAlphaNum *)&cmCTestLog_msg,(cmAlphaNum *)&workdir);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if (unparsedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unparsedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    sVar3 = (this->CaptureCMakeError)._M_string_length;
    if (sVar3 != 0) {
      errorState.CaptureCMakeErrorValue = true;
    }
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"CTEST_CONFIGURATION_TYPE",(allocator<char> *)&workdir);
    cVar9 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (cVar9.Value != (string *)0x0) {
      cmCTest::SetConfigType((this->super_cmCTestCommand).CTest,cVar9.Value);
    }
    if ((this->Build)._M_string_length == 0) {
      pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg,"CTEST_BINARY_DIRECTORY",(allocator<char> *)&workdir);
      psVar10 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if (psVar10->_M_string_length != 0) {
        pcVar2 = (this->super_cmCTestCommand).CTest;
        cmsys::SystemTools::CollapseFullPath((string *)&cmCTestLog_msg,psVar10);
        cmCTest::SetCTestConfiguration
                  (pcVar2,"BuildDirectory",(string *)&cmCTestLog_msg,this->Quiet);
        goto LAB_001c4e7d;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"CTEST_BINARY_DIRECTORY not set");
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar2 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x92,workdir.OldDir._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&workdir);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    else {
      pcVar2 = (this->super_cmCTestCommand).CTest;
      cmsys::SystemTools::CollapseFullPath((string *)&cmCTestLog_msg,&this->Build);
      cmCTest::SetCTestConfiguration(pcVar2,"BuildDirectory",(string *)&cmCTestLog_msg,this->Quiet);
LAB_001c4e7d:
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
    if ((this->Source)._M_string_length == 0) {
      pcVar2 = (this->super_cmCTestCommand).CTest;
      pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&workdir,"CTEST_SOURCE_DIRECTORY",(allocator<char> *)&local_2b0);
      psVar10 = cmMakefile::GetSafeDefinition(pcVar1,&workdir.OldDir);
      cmsys::SystemTools::CollapseFullPath((string *)&cmCTestLog_msg,psVar10);
      cmCTest::SetCTestConfiguration(pcVar2,"SourceDirectory",(string *)&cmCTestLog_msg,this->Quiet)
      ;
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      this_00 = &workdir;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Set source directory to: ");
      poVar8 = std::operator<<(poVar8,(string *)&this->Source);
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar2 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x97,workdir.OldDir._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&workdir);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      pcVar2 = (this->super_cmCTestCommand).CTest;
      cmsys::SystemTools::CollapseFullPath((string *)&cmCTestLog_msg,&this->Source);
      cmCTest::SetCTestConfiguration(pcVar2,"SourceDirectory",(string *)&cmCTestLog_msg,this->Quiet)
      ;
      this_00 = (cmWorkingDirectory *)&cmCTestLog_msg;
    }
    std::__cxx11::string::~string((string *)this_00);
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"CTEST_CHANGE_ID",(allocator<char> *)&workdir);
    cVar9 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (cVar9.Value != (string *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestCommand).CTest,"ChangeId",cVar9.Value,this->Quiet);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Initialize handler");
    std::endl<char,std::char_traits<char>>(poVar8);
    pcVar2 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                 ,0xa7,workdir.OldDir._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&workdir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar5 = (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[5])(this);
    plVar11 = (long *)CONCAT44(extraout_var,iVar5);
    psVar10 = &this->CaptureCMakeError;
    if (plVar11 != (long *)0x0) {
      *(bool *)(plVar11 + 1) = this->Append;
      (**(code **)*plVar11)(plVar11,(this->super_cmCTestCommand).super_cmCommand.Makefile);
      if ((this->SubmitIndex)._M_string_length != 0) {
        iVar5 = atoi((this->SubmitIndex)._M_dataplus._M_p);
        *(int *)(plVar11 + 0x23) = iVar5;
      }
      pcVar2 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"BuildDirectory",(allocator<char> *)&local_c0);
      cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg,pcVar2,&local_2b0);
      cmWorkingDirectory::cmWorkingDirectory(&workdir,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&local_2b0);
      if (workdir.ResultCode == 0) {
        iVar5 = (**(code **)(*plVar11 + 8))(plVar11);
        if ((this->ReturnValue)._M_string_length != 0) {
          pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
          std::__cxx11::to_string((string *)&cmCTestLog_msg,iVar5);
          value_02._M_str = _cmCTestLog_msg;
          value_02._M_len = (size_t)local_248;
          cmMakefile::AddDefinition(pcVar1,&this->ReturnValue,value_02);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        }
        (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[6])(this,plVar11);
        bVar14 = true;
        if (sVar3 != 0) {
          bVar4 = cmSystemTools::GetErrorOccurredFlag();
          if (bVar4) {
            pcVar12 = cmsys::SystemTools::FindLastString
                                ((status->Error)._M_dataplus._M_p,"unknown error.");
            pcVar7 = "-1";
            if (pcVar12 == (char *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              std::operator<<((ostream *)&cmCTestLog_msg,(string *)&status->Error);
              pcVar2 = (this->super_cmCTestCommand).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                           ,0xdc,local_2b0._M_dataplus._M_p,false);
              std::__cxx11::string::~string((string *)&local_2b0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            }
          }
          else {
            pcVar7 = "0";
          }
          pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
          sVar13 = strlen(pcVar7);
          value_03._M_str = pcVar7;
          value_03._M_len = sVar13;
          cmMakefile::AddDefinition(pcVar1,psVar10,value_03);
        }
      }
      else {
        pcVar2 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"BuildDirectory",&local_289);
        cmCTest::GetCTestConfiguration(&local_80,pcVar2,&local_a0);
        std::operator+(&local_c0,"failed to change directory to ",&local_80);
        std::operator+(&local_2b0,&local_c0," : ");
        pcVar7 = strerror(workdir.ResultCode);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg,&local_2b0,pcVar7);
        cmCommand::SetError((cmCommand *)this,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        if (sVar3 == 0) {
          bVar14 = false;
        }
        else {
          value_00._M_str = "-1";
          value_00._M_len = 2;
          cmMakefile::AddDefinition
                    ((this->super_cmCTestCommand).super_cmCommand.Makefile,psVar10,value_00);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[4])(&local_2b0,this);
          poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&local_2b0);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(string *)&status->Error);
          std::operator<<(poVar8,"\n");
          std::__cxx11::string::~string((string *)&local_2b0);
          pcVar2 = (this->super_cmCTestCommand).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                       ,199,local_2b0._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          bVar14 = true;
        }
      }
      cmWorkingDirectory::~cmWorkingDirectory(&workdir);
      goto LAB_001c5592;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Cannot instantiate test handler ");
    (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[4])(&workdir,this);
    poVar8 = std::operator<<(poVar8,(string *)&workdir);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&workdir);
    pcVar2 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                 ,0xac,workdir.OldDir._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&workdir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (sVar3 != 0) {
      value_01._M_str = "-1";
      value_01._M_len = 2;
      cmMakefile::AddDefinition
                ((this->super_cmCTestCommand).super_cmCommand.Makefile,psVar10,value_01);
      pcVar7 = cmsys::SystemTools::FindLastString((status->Error)._M_dataplus._M_p,"unknown error.")
      ;
      bVar14 = true;
      if (pcVar7 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&status->Error);
        std::operator<<(poVar8," error from command\n");
        pcVar2 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                     ,0xb1,workdir.OldDir._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&workdir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      goto LAB_001c5592;
    }
  }
  else {
    _cmCTestLog_msg = &DAT_0000001e;
    workdir.OldDir._M_string_length =
         (size_type)
         ((unparsedArguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    workdir.OldDir._M_dataplus._M_p =
         (pointer)(unparsedArguments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    cmStrCat<char[3]>(&local_2b0,(cmAlphaNum *)&cmCTestLog_msg,(cmAlphaNum *)&workdir,
                      (char (*) [3])0x617de4);
    cmCommand::SetError((cmCommand *)this,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    if ((this->CaptureCMakeError)._M_string_length != 0) {
      errorState.CaptureCMakeErrorValue = true;
      value._M_str = "-1";
      value._M_len = 2;
      cmMakefile::AddDefinition
                ((this->super_cmCTestCommand).super_cmCommand.Makefile,&this->CaptureCMakeError,
                 value);
      (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[4])(&local_2b0,this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,&local_2b0," ");
      std::operator+(&workdir.OldDir,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,&status->Error);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&local_2b0);
      pcVar7 = cmsys::SystemTools::FindLastString(workdir.OldDir._M_dataplus._M_p,"unknown error.");
      if (pcVar7 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&workdir);
        std::operator<<(poVar8," error from command\n");
        pcVar2 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                     ,0x73,local_2b0._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      std::__cxx11::string::~string((string *)&workdir);
      bVar14 = true;
      goto LAB_001c5592;
    }
  }
  bVar14 = false;
LAB_001c5592:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unparsedArguments);
  anon_unknown.dwarf_35d14c::SaveRestoreErrorState::~SaveRestoreErrorState(&errorState);
  return bVar14;
}

Assistant:

bool cmCTestHandlerCommand::InitialPass(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  // save error state and restore it if needed
  SaveRestoreErrorState errorState;
  // Allocate space for argument values.
  this->BindArguments();

  // Process input arguments.
  std::vector<std::string> unparsedArguments;
  this->Parse(args, &unparsedArguments);
  this->CheckArguments();

  std::sort(this->ParsedKeywords.begin(), this->ParsedKeywords.end());
  auto it = std::adjacent_find(this->ParsedKeywords.begin(),
                               this->ParsedKeywords.end());
  if (it != this->ParsedKeywords.end()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Called with more than one value for ", *it));
  }

  bool const foundBadArgument = !unparsedArguments.empty();
  if (foundBadArgument) {
    this->SetError(cmStrCat("called with unknown argument \"",
                            unparsedArguments.front(), "\"."));
  }
  bool const captureCMakeError = !this->CaptureCMakeError.empty();
  // now that arguments are parsed check to see if there is a
  // CAPTURE_CMAKE_ERROR specified let the errorState object know.
  if (captureCMakeError) {
    errorState.CaptureCMakeError();
  }
  // if we found a bad argument then exit before running command
  if (foundBadArgument) {
    // store the cmake error
    if (captureCMakeError) {
      this->Makefile->AddDefinition(this->CaptureCMakeError, "-1");
      std::string const err = this->GetName() + " " + status.GetError();
      if (!cmSystemTools::FindLastString(err.c_str(), "unknown error.")) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, err << " error from command\n");
      }
      // return success because failure is recorded in CAPTURE_CMAKE_ERROR
      return true;
    }
    // return failure because of bad argument
    return false;
  }

  // Set the config type of this ctest to the current value of the
  // CTEST_CONFIGURATION_TYPE script variable if it is defined.
  // The current script value trumps the -C argument on the command
  // line.
  cmValue ctestConfigType =
    this->Makefile->GetDefinition("CTEST_CONFIGURATION_TYPE");
  if (ctestConfigType) {
    this->CTest->SetConfigType(*ctestConfigType);
  }

  if (!this->Build.empty()) {
    this->CTest->SetCTestConfiguration(
      "BuildDirectory", cmSystemTools::CollapseFullPath(this->Build),
      this->Quiet);
  } else {
    std::string const& bdir =
      this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");
    if (!bdir.empty()) {
      this->CTest->SetCTestConfiguration(
        "BuildDirectory", cmSystemTools::CollapseFullPath(bdir), this->Quiet);
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "CTEST_BINARY_DIRECTORY not set" << std::endl;);
    }
  }
  if (!this->Source.empty()) {
    cmCTestLog(this->CTest, DEBUG,
               "Set source directory to: " << this->Source << std::endl);
    this->CTest->SetCTestConfiguration(
      "SourceDirectory", cmSystemTools::CollapseFullPath(this->Source),
      this->Quiet);
  } else {
    this->CTest->SetCTestConfiguration(
      "SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY")),
      this->Quiet);
  }

  if (cmValue changeId = this->Makefile->GetDefinition("CTEST_CHANGE_ID")) {
    this->CTest->SetCTestConfiguration("ChangeId", *changeId, this->Quiet);
  }

  cmCTestLog(this->CTest, DEBUG, "Initialize handler" << std::endl;);
  cmCTestGenericHandler* handler = this->InitializeHandler();
  if (!handler) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot instantiate test handler " << this->GetName()
                                                  << std::endl);
    if (captureCMakeError) {
      this->Makefile->AddDefinition(this->CaptureCMakeError, "-1");
      std::string const& err = status.GetError();
      if (!cmSystemTools::FindLastString(err.c_str(), "unknown error.")) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, err << " error from command\n");
      }
      return true;
    }
    return false;
  }

  handler->SetAppendXML(this->Append);

  handler->PopulateCustomVectors(this->Makefile);
  if (!this->SubmitIndex.empty()) {
    handler->SetSubmitIndex(atoi(this->SubmitIndex.c_str()));
  }
  cmWorkingDirectory workdir(
    this->CTest->GetCTestConfiguration("BuildDirectory"));
  if (workdir.Failed()) {
    this->SetError("failed to change directory to " +
                   this->CTest->GetCTestConfiguration("BuildDirectory") +
                   " : " + std::strerror(workdir.GetLastResult()));
    if (captureCMakeError) {
      this->Makefile->AddDefinition(this->CaptureCMakeError, "-1");
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 this->GetName() << " " << status.GetError() << "\n");
      // return success because failure is recorded in CAPTURE_CMAKE_ERROR
      return true;
    }
    return false;
  }

  int res = handler->ProcessHandler();
  if (!this->ReturnValue.empty()) {
    this->Makefile->AddDefinition(this->ReturnValue, std::to_string(res));
  }
  this->ProcessAdditionalValues(handler);
  // log the error message if there was an error
  if (captureCMakeError) {
    const char* returnString = "0";
    if (cmSystemTools::GetErrorOccurredFlag()) {
      returnString = "-1";
      std::string const& err = status.GetError();
      // print out the error if it is not "unknown error" which means
      // there was no message
      if (!cmSystemTools::FindLastString(err.c_str(), "unknown error.")) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, err);
      }
    }
    // store the captured cmake error state 0 or -1
    this->Makefile->AddDefinition(this->CaptureCMakeError, returnString);
  }
  return true;
}